

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

int Ga2_ManMarkup(Gia_Man_t *p,int N,int fSimple)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  Gia_Obj_t *pObjRi;
  int CountMarks;
  int Leaf;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLeaves;
  int fSimple_local;
  int N_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  if (fSimple == 0) {
    Leaf = 0;
    while( true ) {
      bVar7 = false;
      if (Leaf < p->nObjs) {
        _k = Gia_ManObj(p,Leaf);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      _k->Value = 0;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 != 0) {
        pGVar6 = Gia_ObjFanin0(_k);
        pGVar6->Value = pGVar6->Value + 1;
        pGVar6 = Gia_ObjFanin1(_k);
        pGVar6->Value = pGVar6->Value + 1;
        iVar1 = Gia_ObjIsMuxType(_k);
        if (iVar1 != 0) {
          pGVar6 = Gia_ObjFanin0(_k);
          pGVar6 = Gia_ObjFanin0(pGVar6);
          pGVar6->Value = pGVar6->Value + 1;
          pGVar6 = Gia_ObjFanin0(_k);
          pGVar6 = Gia_ObjFanin1(pGVar6);
          pGVar6->Value = pGVar6->Value + 1;
          pGVar6 = Gia_ObjFanin1(_k);
          pGVar6 = Gia_ObjFanin0(pGVar6);
          pGVar6->Value = pGVar6->Value + 1;
          pGVar6 = Gia_ObjFanin1(_k);
          pGVar6 = Gia_ObjFanin1(pGVar6);
          pGVar6->Value = pGVar6->Value + 1;
        }
      }
      Leaf = Leaf + 1;
    }
    Leaf = 0;
    while( true ) {
      bVar7 = false;
      if (Leaf < p->nObjs) {
        _k = Gia_ManObj(p,Leaf);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      *(ulong *)_k = *(ulong *)_k & 0x7fffffffffffffff;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(_k);
        if (iVar1 == 0) {
          *(ulong *)_k = *(ulong *)_k & 0x7fffffffffffffff | 0x8000000000000000;
        }
        else {
          pGVar6 = Gia_ObjFanin0(_k);
          *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0x7fffffffffffffff | 0x8000000000000000;
        }
      }
      else {
        *(ulong *)_k = *(ulong *)_k & 0x7fffffffffffffff | (ulong)(1 < _k->Value) << 0x3f;
      }
      Leaf = Leaf + 1;
    }
    Leaf = 0;
    while( true ) {
      bVar7 = false;
      if (Leaf < p->nObjs) {
        _k = Gia_ManObj(p,Leaf);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(_k);
      if ((iVar1 != 0) && (*(long *)_k < 0)) {
        Vec_IntClear(p_00);
        Ga2_ManCollectLeaves_rec(p,_k,p_00,1);
        iVar1 = Vec_IntSize(p_00);
        if (N < iVar1) {
          Ga2_ManBreakTree_rec(p,_k,1,N);
        }
      }
      Leaf = Leaf + 1;
    }
  }
  else {
    Leaf = 0;
    while( true ) {
      bVar7 = false;
      if (Leaf < p->nObjs) {
        _k = Gia_ManObj(p,Leaf);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsCo(_k);
      *(ulong *)_k = *(ulong *)_k & 0x7fffffffffffffff | (ulong)(iVar1 == 0) << 0x3f;
      Leaf = Leaf + 1;
    }
  }
  Vec_IntFreeP(&p->vMapping);
  iVar1 = Gia_ManObjNum(p);
  pVVar4 = Vec_IntStart(iVar1);
  p->vMapping = pVVar4;
  Leaf = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Leaf < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _k = Gia_ManCi(p,iVar1 + Leaf);
      bVar7 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) {
      pObjRi._0_4_ = Gia_ManRegNum(p);
      Leaf = 0;
      while( true ) {
        bVar7 = false;
        if (Leaf < p->nObjs) {
          _k = Gia_ManObj(p,Leaf);
          bVar7 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        iVar1 = Gia_ObjIsAnd(_k);
        if ((iVar1 != 0) && (*(long *)_k < 0)) {
          Vec_IntClear(p_00);
          Ga2_ManCollectLeaves_rec(p,_k,p_00,1);
          iVar1 = Vec_IntSize(p_00);
          if (N < iVar1) {
            __assert_fail("Vec_IntSize(vLeaves) <= N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                          ,0x13f,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
          }
          pVVar4 = p->vMapping;
          iVar1 = Vec_IntSize(p->vMapping);
          Vec_IntWriteEntry(pVVar4,Leaf,iVar1);
          pVVar4 = p->vMapping;
          iVar1 = Vec_IntSize(p_00);
          Vec_IntPush(pVVar4,iVar1);
          for (CountMarks = 0; iVar1 = Vec_IntSize(p_00), CountMarks < iVar1;
              CountMarks = CountMarks + 1) {
            iVar1 = Vec_IntEntry(p_00,CountMarks);
            Vec_IntPush(p->vMapping,iVar1);
            uVar3 = Ga2_ManMarkup::uTruth5[CountMarks];
            pGVar6 = Gia_ManObj(p,iVar1);
            pGVar6->Value = uVar3;
            pGVar6 = Gia_ManObj(p,iVar1);
            if (-1 < *(long *)pGVar6) {
              __assert_fail("Gia_ManObj(p, Leaf)->fPhase",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                            ,0x147,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
            }
          }
          pVVar4 = p->vMapping;
          uVar3 = Ga2_ObjComputeTruth_rec(p,_k,1);
          Vec_IntPush(pVVar4,uVar3);
          Vec_IntPush(p->vMapping,-1);
          pObjRi._0_4_ = (int)pObjRi + 1;
        }
        Leaf = Leaf + 1;
      }
      Vec_IntFree(p_00);
      Gia_ManCleanValue(p);
      return (int)pObjRi;
    }
    pGVar6 = Gia_ObjRoToRi(p,_k);
    if (-1 < *(long *)_k) {
      __assert_fail("pObj->fPhase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x12f,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
    }
    pGVar5 = Gia_ObjFanin0(pGVar6);
    if (-1 < *(long *)pGVar5) break;
    pVVar4 = p->vMapping;
    iVar1 = Gia_ObjId(p,_k);
    iVar2 = Vec_IntSize(p->vMapping);
    Vec_IntWriteEntry(pVVar4,iVar1,iVar2);
    Vec_IntPush(p->vMapping,1);
    pVVar4 = p->vMapping;
    iVar1 = Gia_ObjFaninId0p(p,pGVar6);
    Vec_IntPush(pVVar4,iVar1);
    pVVar4 = p->vMapping;
    iVar2 = Gia_ObjFaninC0(pGVar6);
    iVar1 = -0x55555556;
    if (iVar2 != 0) {
      iVar1 = 0x55555555;
    }
    Vec_IntPush(pVVar4,iVar1);
    Vec_IntPush(p->vMapping,-1);
    Leaf = Leaf + 1;
  }
  __assert_fail("Gia_ObjFanin0(pObjRi)->fPhase",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                ,0x130,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
}

Assistant:

int Ga2_ManMarkup( Gia_Man_t * p, int N, int fSimple )
{
    static unsigned uTruth5[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
//    abctime clk = Abc_Clock();
    Vec_Int_t * vLeaves;
    Gia_Obj_t * pObj;
    int i, k, Leaf, CountMarks;

    vLeaves = Vec_IntAlloc( 100 );

    if ( fSimple )
    {
        Gia_ManForEachObj( p, pObj, i )
            pObj->fPhase = !Gia_ObjIsCo(pObj);
    }
    else
    {
        // label nodes with multiple fanouts and inputs MUXes
        Gia_ManForEachObj( p, pObj, i )
        {
            pObj->Value = 0;
            if ( !Gia_ObjIsAnd(pObj) )
                continue;
            Gia_ObjFanin0(pObj)->Value++;
            Gia_ObjFanin1(pObj)->Value++;
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            Gia_ObjFanin0(Gia_ObjFanin0(pObj))->Value++;
            Gia_ObjFanin1(Gia_ObjFanin0(pObj))->Value++;
            Gia_ObjFanin0(Gia_ObjFanin1(pObj))->Value++;
            Gia_ObjFanin1(Gia_ObjFanin1(pObj))->Value++;
        }
        Gia_ManForEachObj( p, pObj, i )
        {
            pObj->fPhase = 0;
            if ( Gia_ObjIsAnd(pObj) )
                pObj->fPhase = (pObj->Value > 1);
            else if ( Gia_ObjIsCo(pObj) )
                Gia_ObjFanin0(pObj)->fPhase = 1;
            else 
                pObj->fPhase = 1;
        } 
        // add marks when needed
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !pObj->fPhase )
                continue;
            Vec_IntClear( vLeaves );
            Ga2_ManCollectLeaves_rec( p, pObj, vLeaves, 1 );
            if ( Vec_IntSize(vLeaves) > N )
                Ga2_ManBreakTree_rec( p, pObj, 1, N );
        }
    }

    // verify that the tree is split correctly
    Vec_IntFreeP( &p->vMapping );
    p->vMapping = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        Gia_Obj_t * pObjRi = Gia_ObjRoToRi(p, pObj);
        assert( pObj->fPhase );
        assert( Gia_ObjFanin0(pObjRi)->fPhase );
        // create map
        Vec_IntWriteEntry( p->vMapping, Gia_ObjId(p, pObj), Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, 1 );
        Vec_IntPush( p->vMapping, Gia_ObjFaninId0p(p, pObjRi) );
        Vec_IntPush( p->vMapping, Gia_ObjFaninC0(pObjRi) ? 0x55555555 : 0xAAAAAAAA );
        Vec_IntPush( p->vMapping, -1 );  // placeholder for ref counter
    }
    CountMarks = Gia_ManRegNum(p);
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fPhase )
            continue;
        Vec_IntClear( vLeaves );
        Ga2_ManCollectLeaves_rec( p, pObj, vLeaves, 1 );
        assert( Vec_IntSize(vLeaves) <= N );
        // create map
        Vec_IntWriteEntry( p->vMapping, i, Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, Leaf, k )
        {            
            Vec_IntPush( p->vMapping, Leaf );
            Gia_ManObj(p, Leaf)->Value = uTruth5[k];
            assert( Gia_ManObj(p, Leaf)->fPhase );
        }
        Vec_IntPush( p->vMapping,  (int)Ga2_ObjComputeTruth_rec( p, pObj, 1 ) );
        Vec_IntPush( p->vMapping, -1 );  // placeholder for ref counter
        CountMarks++;
    }
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_IntFree( vLeaves );
    Gia_ManCleanValue( p );
    return CountMarks;
}